

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::anon_unknown_12::ScanLineProcess::copy_sample_count
          (ScanLineProcess *this,DeepFrameBuffer *outfb,int fbY)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  int32_t *piVar5;
  Slice *pSVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  char *__dest;
  long lVar11;
  
  pSVar6 = DeepFrameBuffer::getSampleCountSlice(outfb);
  iVar1 = (this->cinfo).height;
  iVar2 = (this->decoder).user_line_end_ignore;
  sVar3 = pSVar6->xStride;
  sVar4 = pSVar6->yStride;
  lVar10 = (long)(this->decoder).user_line_begin_skip;
  lVar11 = lVar10 * 4;
  for (; lVar10 < (long)iVar1 - (long)iVar2; lVar10 = lVar10 + 1) {
    iVar7 = (this->cinfo).width;
    lVar8 = (long)iVar7;
    __dest = pSVar6->base + (fbY + lVar10) * sVar4 + (long)(this->cinfo).start_x * sVar3;
    piVar5 = (this->decoder).sample_count_table;
    if (sVar3 == 4) {
      memcpy(__dest,piVar5 + lVar10 * lVar8,lVar8 << 2);
    }
    else {
      for (lVar9 = 0; lVar9 < iVar7; lVar9 = lVar9 + 1) {
        *(undefined4 *)__dest = *(undefined4 *)((long)piVar5 + lVar9 * 4 + lVar8 * lVar11);
        __dest = __dest + sVar3;
        iVar7 = (this->cinfo).width;
      }
    }
    lVar11 = lVar11 + 4;
  }
  return;
}

Assistant:

void ScanLineProcess::copy_sample_count (
    const DeepFrameBuffer *outfb,
    int fbY)
{
    const Slice& scslice = outfb->getSampleCountSlice ();

    int     end = cinfo.height - decoder.user_line_end_ignore;
    int64_t xS = int64_t (scslice.xStride);
    int64_t yS = int64_t (scslice.yStride);

    for ( int y = decoder.user_line_begin_skip; y < end; ++y )
    {
        const int32_t* counts = decoder.sample_count_table + y * cinfo.width;
        uint8_t*       ptr;

        ptr = reinterpret_cast<uint8_t*> (scslice.base);
        ptr += int64_t (cinfo.start_x) * xS;
        ptr += (int64_t (fbY) + int64_t (y)) * yS;

        if (xS == sizeof(int32_t))
        {
            memcpy (ptr, counts, cinfo.width * sizeof(int32_t));
        }
        else
        {
            for ( int x = 0; x < cinfo.width; ++x )
            {
                *((int32_t *)ptr) = counts[x];
                ptr += xS;
            }
        }
    }
}